

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O3

String * __thiscall
kj::encodeHex(String *__return_storage_ptr__,kj *this,ArrayPtr<const_unsigned_char> input)

{
  unsigned_long i;
  uchar *puVar1;
  uchar *puVar2;
  Iterator __end1;
  
  puVar2 = input.ptr;
  heapString(__return_storage_ptr__,(long)puVar2 * 2);
  if (puVar2 != (uchar *)0x0) {
    puVar1 = (uchar *)0x0;
    do {
      (__return_storage_ptr__->content).ptr[(long)puVar1 * 2] =
           "0123456789abcdef"[(byte)this[(long)puVar1] >> 4];
      (__return_storage_ptr__->content).ptr[(long)puVar1 * 2 + 1] =
           "0123456789abcdef"[(byte)this[(long)puVar1] & 0xf];
      puVar1 = puVar1 + 1;
    } while (puVar2 != puVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

String encodeHex(ArrayPtr<const byte> input) {
  auto result = heapString(input.size() * 2);
  for (auto i: kj::indices(input)) {
    result[i*2] = HEX_DIGITS[input[i] / 16];
    result[i*2+1] = HEX_DIGITS[input[i] % 16];
  }
  return result;
}